

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

int __thiscall MemoryLeakDetectorNode::init(MemoryLeakDetectorNode *this,EVP_PKEY_CTX *ctx)

{
  undefined4 in_EAX;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_R8;
  undefined4 in_R9D;
  MemoryLeakDetectorNode in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  
  *(undefined4 *)(this + 8) = in_EDX;
  *(EVP_PKEY_CTX **)(this + 0x10) = ctx;
  *(undefined8 *)this = in_RCX;
  *(undefined8 *)(this + 0x28) = in_R8;
  *(undefined4 *)(this + 0x30) = in_R9D;
  this[0x34] = in_stack_00000008;
  *(undefined8 *)(this + 0x18) = in_stack_00000010;
  *(undefined8 *)(this + 0x20) = in_stack_00000018;
  return CONCAT31((int3)((uint)in_EAX >> 8),in_stack_00000008);
}

Assistant:

void MemoryLeakDetectorNode::init(char* memory, unsigned number, size_t size, TestMemoryAllocator* allocator, MemLeakPeriod period, unsigned char allocation_stage, const char* file, size_t line)
{
    number_ = number;
    memory_ = memory;
    size_ = size;
    allocator_ = allocator;
    period_ = period;
    allocation_stage_ = allocation_stage;
    file_ = file;
    line_ = line;
}